

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  ushort uVar1;
  ushort *in_RSI;
  ImFontGlyphRangesBuilder *in_RDI;
  uint c;
  ushort in_stack_ffffffffffffffde;
  uint local_14;
  ushort *local_10;
  
  for (local_10 = in_RSI; *local_10 != 0; local_10 = local_10 + 2) {
    local_14 = (uint)*local_10;
    while( true ) {
      uVar1 = in_stack_ffffffffffffffde & 0xff;
      if (local_14 <= local_10[1]) {
        uVar1 = CONCAT11(local_14 < 0x10000,(char)in_stack_ffffffffffffffde);
      }
      in_stack_ffffffffffffffde = uVar1;
      if ((char)(in_stack_ffffffffffffffde >> 8) == '\0') break;
      AddChar(in_RDI,in_stack_ffffffffffffffde);
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (unsigned int c = ranges[0]; c <= ranges[1] && c <= IM_UNICODE_CODEPOINT_MAX; c++) //-V560
            AddChar((ImWchar)c);
}